

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O3

void __thiscall ProblemTest_MaxLogicalCons_Test::TestBody(ProblemTest_MaxLogicalCons_Test *this)

{
  bool bVar1;
  LogicalConstant LVar2;
  int iVar3;
  char *pcVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Problem p;
  AssertHelper local_3b0;
  AssertionResult local_3a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  long local_388 [2];
  BasicProblem<mp::BasicProblemParams<int>_> local_378;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_378);
  iVar3 = 100;
  do {
    LVar2 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                      (&local_378.super_ExprFactory,true);
    mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
              (&local_378,
               (LogicalExpr)
               LVar2.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  local_3a8.success_ = true;
  local_3a8._1_3_ = 0;
  local_3b0.data_._0_4_ =
       (undefined4)
       ((ulong)((long)local_378.logical_cons_.
                      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_378.logical_cons_.
                     super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_398,"100","p.num_logical_cons()",(int *)&local_3a8,(int *)&local_3b0
            );
  if (local_398.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if (local_390.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_390.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1d0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (((CONCAT44(local_3a8._4_4_,local_3a8._0_4_) != 0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((long *)CONCAT44(local_3a8._4_4_,local_3a8._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_3a8._4_4_,local_3a8._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_3a8.success_ == true) {
    local_398.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_398,"too many logical constraints","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      LVar2 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                        (&local_378.super_ExprFactory,true);
      mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                (&local_378,
                 (LogicalExpr)
                 LVar2.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_)
      ;
    }
    testing::AssertionResult::operator<<
              (&local_3a8,
               (char (*) [123])
               "Expected: p.AddCon(p.MakeLogicalConstant(true)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_398.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388) {
      operator_delete(local_398.ptr_,local_388[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_398);
  if (local_3a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = ((local_3a8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x1d2,pcVar4);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_398);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  if (((local_398.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_398.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_398.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_378);
  return;
}

Assistant:

TEST(ProblemTest, MaxLogicalCons) {
  Problem p;
  for (int i = 0; i < MP_MAX_PROBLEM_ITEMS; ++i)
    p.AddCon(p.MakeLogicalConstant(true));
  EXPECT_EQ(MP_MAX_PROBLEM_ITEMS, p.num_logical_cons());
  EXPECT_ASSERT(p.AddCon(p.MakeLogicalConstant(true)),
                "too many logical constraints");
}